

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string_view __thiscall slang::parsing::Token::rawText(Token *this)

{
  short sVar1;
  bool bVar2;
  short *in_RDI;
  string_view sVar3;
  string_view text;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  sVar3 = LexerFacts::getTokenKindText((TokenKind)((ulong)in_RDI >> 0x30));
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffd8);
  __str = (char *)sVar3._M_len;
  this_00 = (basic_string_view<char,_std::char_traits<char>_> *)sVar3._M_str;
  if (bVar2) {
    sVar1 = *in_RDI;
    if (sVar1 == 0) {
      if (*(long *)(in_RDI + 4) == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
        __str = (char *)local_10._M_len;
        this_00 = (basic_string_view<char,_std::char_traits<char>_> *)local_10._M_str;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_10,(char *)**(undefined8 **)(in_RDI + 4),(ulong)*(uint *)(in_RDI + 2));
        __str = (char *)local_10._M_len;
        this_00 = (basic_string_view<char,_std::char_traits<char>_> *)local_10._M_str;
      }
    }
    else if ((sVar1 == 1) || ((7 < (ushort)(sVar1 - 2U) && (sVar1 == 10)))) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this_00,__str);
      __str = (char *)local_10._M_len;
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)local_10._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_10,(char *)**(undefined8 **)(in_RDI + 4),(ulong)*(uint *)(in_RDI + 2));
      __str = (char *)local_10._M_len;
      this_00 = (basic_string_view<char,_std::char_traits<char>_> *)local_10._M_str;
    }
  }
  local_10._M_str = (char *)this_00;
  local_10._M_len = (size_t)__str;
  sVar3._M_str = local_10._M_str;
  sVar3._M_len = local_10._M_len;
  return sVar3;
}

Assistant:

std::string_view Token::rawText() const {
    std::string_view text = LexerFacts::getTokenKindText(kind);
    if (!text.empty())
        return text;

    // not a simple token, so extract info from our data pointer
    switch (kind) {
        case TokenKind::Identifier:
        case TokenKind::SystemIdentifier:
        case TokenKind::IncludeFileName:
        case TokenKind::StringLiteral:
        case TokenKind::IntegerLiteral:
        case TokenKind::IntegerBase:
        case TokenKind::UnbasedUnsizedLiteral:
        case TokenKind::RealLiteral:
        case TokenKind::TimeLiteral:
        case TokenKind::Directive:
        case TokenKind::MacroUsage:
        case TokenKind::EmptyMacroArgument:
        case TokenKind::LineContinuation:
            return std::string_view(info->rawTextPtr, rawLen);
        case TokenKind::Unknown:
            if (info)
                return std::string_view(info->rawTextPtr, rawLen);
            return "";
        case TokenKind::Placeholder:
        case TokenKind::EndOfFile:
            return "";
        default:
            SLANG_UNREACHABLE;
    }
}